

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O1

int big_block_mpi_grow(BigBlock *bb,int Nfile_grow,size_t *fsize_grow,MPI_Comm comm)

{
  int iVar1;
  FILE *__stream;
  MPI_Comm extraout_RDX;
  MPI_Comm extraout_RDX_00;
  MPI_Comm comm_00;
  long lVar2;
  ulong uVar3;
  int rank;
  int NTask;
  int local_48;
  int local_44 [3];
  ulong local_38;
  
  if (comm == (MPI_Comm)&ompi_mpi_comm_null) {
    iVar1 = 0;
  }
  else {
    MPI_Comm_size(comm,local_44);
    MPI_Comm_rank(comm,&local_48);
    local_38 = (ulong)(uint)bb->Nfile;
    iVar1 = 0;
    if (local_48 == 0) {
      iVar1 = _big_block_grow_internal(bb,Nfile_grow,fsize_grow);
    }
    iVar1 = big_file_mpi_broadcast_anyerror(iVar1,comm);
    if (iVar1 == 0) {
      comm_00 = extraout_RDX;
      if (local_48 != 0) {
        _big_block_close_internal(bb);
        comm_00 = extraout_RDX_00;
      }
      big_block_mpi_broadcast(bb,(int)comm,comm_00);
      lVar2 = (long)Nfile_grow;
      local_44[1] = 0;
      local_44[2] = 0;
      uVar3 = (ulong)(int)((ulong)(local_48 * lVar2) / (ulong)(long)local_44[0]);
      if (uVar3 < (ulong)(((long)local_48 + 1) * lVar2) / (ulong)(long)local_44[0]) {
        local_44[1] = 0;
        local_44[2] = 0;
        do {
          __stream = (FILE *)_big_file_open_a_file(bb->basename,(int)local_38 + (int)uVar3,"w",1);
          if (__stream == (FILE *)0x0) {
            local_44[1] = -1;
            local_44[2] = 0;
            break;
          }
          fclose(__stream);
          uVar3 = uVar3 + 1;
        } while (uVar3 < (ulong)(((long)local_48 + 1) * lVar2) / (ulong)(long)local_44[0]);
      }
      iVar1 = big_file_mpi_broadcast_anyerror((int)local_44._4_8_,comm);
    }
  }
  return iVar1;
}

Assistant:

int
big_block_mpi_grow(BigBlock * bb,
    int Nfile_grow,
    const size_t fsize_grow[],
    MPI_Comm comm) {

    int rank;
    int NTask;
    int rt;

    if(comm == MPI_COMM_NULL) return 0;

    MPI_Comm_size(comm, &NTask);
    MPI_Comm_rank(comm, &rank);

    int oldNfile = bb->Nfile;

    if(rank == 0) {
        rt = _big_block_grow_internal(bb, Nfile_grow, fsize_grow);
    } else {
        rt = 0;
    }

    BCAST_AND_RAISEIF(rt, comm);

    if(rank != 0) {
        /* closed on non-root because we will bcast.*/
        _big_block_close_internal(bb);
    }
    big_block_mpi_broadcast(bb, 0, comm);

    int i;
    for(i = (size_t) Nfile_grow * rank / NTask; i < (size_t) Nfile_grow * (rank + 1) / NTask; i ++) {
        FILE * fp = _big_file_open_a_file(bb->basename, i + oldNfile, "w", 1);
        if(fp == NULL) {
            rt = -1;
            break;
        }
        fclose(fp);
    }

    BCAST_AND_RAISEIF(rt, comm);

    return rt;
}